

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_check_pubkey(mbedtls_ecp_group *grp,mbedtls_ecp_point *pt)

{
  int iVar1;
  mbedtls_ecp_curve_type mVar2;
  mbedtls_ecp_point *pt_local;
  mbedtls_ecp_group *grp_local;
  
  iVar1 = mbedtls_mpi_cmp_int(&pt->Z,1);
  if (iVar1 == 0) {
    mVar2 = mbedtls_ecp_get_type(grp);
    if (mVar2 == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS) {
      grp_local._4_4_ = ecp_check_pubkey_sw(grp,pt);
    }
    else {
      grp_local._4_4_ = -0x4f80;
    }
  }
  else {
    grp_local._4_4_ = -0x4c80;
  }
  return grp_local._4_4_;
}

Assistant:

int mbedtls_ecp_check_pubkey(const mbedtls_ecp_group *grp,
                             const mbedtls_ecp_point *pt)
{
    /* Must use affine coordinates */
    if (mbedtls_mpi_cmp_int(&pt->Z, 1) != 0) {
        return MBEDTLS_ERR_ECP_INVALID_KEY;
    }

#if defined(MBEDTLS_ECP_MONTGOMERY_ENABLED)
    if (mbedtls_ecp_get_type(grp) == MBEDTLS_ECP_TYPE_MONTGOMERY) {
        return ecp_check_pubkey_mx(grp, pt);
    }
#endif
#if defined(MBEDTLS_ECP_SHORT_WEIERSTRASS_ENABLED)
    if (mbedtls_ecp_get_type(grp) == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS) {
        return ecp_check_pubkey_sw(grp, pt);
    }
#endif
    return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
}